

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O2

ByteData * cfd::core::HashUtil::Sha512(ByteData *__return_storage_ptr__,ByteData160 *data)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_28;
  
  ByteData160::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&_Stack_28,data);
  Sha512(__return_storage_ptr__,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&_Stack_28)
  ;
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_28);
  return __return_storage_ptr__;
}

Assistant:

ByteData HashUtil::Sha512(const ByteData160 &data) {
  return Sha512(data.GetBytes());
}